

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeInstructions.cpp
# Opt level: O1

Expression * __thiscall
wasm::OptimizeInstructions::optimizeMemoryFill(OptimizeInstructions *this,MemoryFill *memFill)

{
  Id IVar1;
  Name memory;
  bool bVar2;
  Index index;
  int64_t iVar3;
  Drop *this_00;
  Block *pBVar4;
  LocalSet *ptr;
  Const *pCVar5;
  Expression *pEVar6;
  PassRunner *pPVar7;
  Store *pSVar8;
  ulong extraout_RDX;
  ulong extraout_RDX_00;
  uint bytes;
  Type in_R8;
  uchar __tmp;
  unsigned_long x;
  undefined1 auVar9 [16];
  optional<wasm::Type> type;
  optional<wasm::Type> type_00;
  Type TVar10;
  size_t sVar11;
  char *pcVar12;
  Store *local_68;
  Store *local_60;
  Expression *local_58;
  Expression *pEStack_50;
  undefined1 auStack_48 [8];
  uint8_t values [16];
  Builder builder;
  
  if ((memFill->super_SpecificExpression<(wasm::Expression::Id)39>).super_Expression.type.id == 1) {
    return (Expression *)0x0;
  }
  pEVar6 = memFill->size;
  if (pEVar6->_id != ConstId) {
    return (Expression *)0x0;
  }
  pPVar7 = (this->
           super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
           ).super_Pass.runner;
  values._8_8_ = (this->
                 super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                 ).
                 super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                 .
                 super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                 .currModule;
  if (pEVar6->_id != ConstId) {
    __assert_fail("int(_id) == int(T::SpecificId)",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm.h"
                  ,0x31b,"T *wasm::Expression::cast() [T = wasm::Const]");
  }
  iVar3 = Literal::getInteger((Literal *)(pEVar6 + 1));
  if ((iVar3 == 0) &&
     (((pPVar7->options).ignoreImplicitTraps != false ||
      ((pPVar7->options).trapsNeverHappen == true)))) {
    pEVar6 = memFill->dest;
    pSVar8 = (Store *)MixedArena::allocSpace((MixedArena *)(values._8_8_ + 0x200),0x18,8);
    (((SpecificExpression<(wasm::Expression::Id)18> *)
     &pSVar8->super_SpecificExpression<(wasm::Expression::Id)13>)->super_Expression)._id = DropId;
    (((SpecificExpression<(wasm::Expression::Id)18> *)
     &pSVar8->super_SpecificExpression<(wasm::Expression::Id)13>)->super_Expression).type.id = 0;
    *(Expression **)&pSVar8->bytes = pEVar6;
    Drop::finalize((Drop *)pSVar8);
    pEVar6 = memFill->value;
    local_68 = pSVar8;
    this_00 = (Drop *)MixedArena::allocSpace((MixedArena *)(values._8_8_ + 0x200),0x18,8);
    (this_00->super_SpecificExpression<(wasm::Expression::Id)18>).super_Expression._id = DropId;
    (this_00->super_SpecificExpression<(wasm::Expression::Id)18>).super_Expression.type.id = 0;
    this_00->value = pEVar6;
    Drop::finalize(this_00);
    values[0] = '\x02';
    values[1] = '\0';
    values[2] = '\0';
    values[3] = '\0';
    values[4] = '\0';
    values[5] = '\0';
    values[6] = '\0';
    values[7] = '\0';
    type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._8_8_ = 0;
    type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)extraout_RDX;
    local_60 = (Store *)this_00;
    auStack_48 = (undefined1  [8])&local_68;
    pBVar4 = Builder::makeBlock<std::initializer_list<wasm::Expression_*>,_true>
                       ((Builder *)(values + 8),(initializer_list<wasm::Expression_*> *)auStack_48,
                        type);
    return (Expression *)pBVar4;
  }
  pEVar6 = memFill->value;
  bVar2 = true;
  if (pEVar6->_id != ConstId) {
switchD_009e3395_caseD_3:
    goto LAB_009e3693;
  }
  if (*(long *)(pEVar6 + 2) != 2) {
    __assert_fail("type == Type::i32",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/literal.h"
                  ,0x120,"int32_t wasm::Literal::geti32() const");
  }
  IVar1 = pEVar6[1]._id;
  switch(iVar3) {
  case 1:
    pEVar6 = memFill->dest;
    pCVar5 = Builder::makeConst<unsigned_int>((Builder *)(values + 8),(uint)IVar1);
    sVar11 = (memFill->memory).super_IString.str._M_len;
    pcVar12 = (memFill->memory).super_IString.str._M_str;
    TVar10.id = 2;
    bytes = 1;
    break;
  case 2:
    pEVar6 = memFill->dest;
    pCVar5 = Builder::makeConst<unsigned_int>((Builder *)(values + 8),(uint)CONCAT11(IVar1,IVar1));
    sVar11 = (memFill->memory).super_IString.str._M_len;
    pcVar12 = (memFill->memory).super_IString.str._M_str;
    TVar10.id = 2;
    bytes = 2;
    break;
  case 3:
  case 5:
  case 6:
  case 7:
    goto switchD_009e3395_caseD_3;
  case 4:
    if ((IVar1 != InvalidId) && ((pPVar7->options).shrinkLevel != 0)) goto LAB_009e3693;
    pEVar6 = memFill->dest;
    pCVar5 = Builder::makeConst<unsigned_int>((Builder *)(values + 8),(uint)IVar1 * 0x1010101);
    sVar11 = (memFill->memory).super_IString.str._M_len;
    pcVar12 = (memFill->memory).super_IString.str._M_str;
    TVar10.id = 2;
    bytes = 4;
    break;
  case 8:
    if ((IVar1 != InvalidId) && ((pPVar7->options).shrinkLevel != 0)) goto LAB_009e3693;
    pEVar6 = memFill->dest;
    pCVar5 = Builder::makeConst<unsigned_long>
                       ((Builder *)(values + 8),(ulong)IVar1 * 0x101010101010101);
    sVar11 = (memFill->memory).super_IString.str._M_len;
    pcVar12 = (memFill->memory).super_IString.str._M_str;
    TVar10.id = 3;
    bytes = 8;
    break;
  default:
    if (iVar3 != 0x10) goto switchD_009e3395_caseD_3;
    if ((pPVar7->options).shrinkLevel != 0) goto LAB_009e3693;
    if (((((this->
           super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
           ).
           super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
           .
           super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
          .currModule)->features).features & 8) != 0) {
      auVar9 = pshuflw(ZEXT216(CONCAT11(IVar1,IVar1)),ZEXT216(CONCAT11(IVar1,IVar1)),0);
      auStack_48._4_4_ = auVar9._0_4_;
      auStack_48._0_4_ = auStack_48._4_4_;
      values[4] = (char)auStack_48._4_4_;
      values[5] = (char)((uint)auStack_48._4_4_ >> 8);
      values[6] = (char)((uint)auStack_48._4_4_ >> 0x10);
      values[7] = (char)((uint)auStack_48._4_4_ >> 0x18);
      values[0] = (char)auStack_48._4_4_;
      values[1] = (char)((uint)auStack_48._4_4_ >> 8);
      values[2] = (char)((uint)auStack_48._4_4_ >> 0x10);
      values[3] = (char)((uint)auStack_48._4_4_ >> 0x18);
      pEVar6 = memFill->dest;
      pCVar5 = Builder::makeConst<unsigned_char[16]>((Builder *)(values + 8),auStack_48);
      sVar11 = (memFill->memory).super_IString.str._M_len;
      pcVar12 = (memFill->memory).super_IString.str._M_str;
      TVar10.id = 6;
      bytes = 0x10;
      break;
    }
    TVar10.id = (memFill->dest->type).id;
    auVar9._8_8_ = 0;
    auVar9._0_8_ = TVar10.id;
    index = Builder::addVar((Builder *)
                            (this->
                            super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                            ).
                            super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                            .
                            super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                            .currFunction,(Function *)0x0,(Name)(auVar9 << 0x40),in_R8);
    local_58 = (Expression *)CONCAT44(local_58._4_4_,index);
    ptr = Builder::makeLocalTee((Builder *)(values + 8),index,memFill->dest,TVar10);
    x = (ulong)IVar1 * 0x101010101010101;
    pCVar5 = Builder::makeConst<unsigned_long>((Builder *)(values + 8),x);
    local_68 = Builder::makeStore((Builder *)(values + 8),8,(Address)0x0,1,(Expression *)ptr,
                                  (Expression *)pCVar5,(Type)0x3,
                                  (Name)(memFill->memory).super_IString.str);
    pEVar6 = (Expression *)MixedArena::allocSpace((MixedArena *)(values._8_8_ + 0x200),0x18,8);
    pEVar6->_id = LocalGetId;
    *(undefined4 *)(pEVar6 + 1) = local_58._0_4_;
    (pEVar6->type).id = TVar10.id;
    pCVar5 = Builder::makeConst<unsigned_long>((Builder *)(values + 8),x);
    local_60 = Builder::makeStore((Builder *)(values + 8),8,(Address)0x8,1,pEVar6,
                                  (Expression *)pCVar5,(Type)0x3,
                                  (Name)(memFill->memory).super_IString.str);
    auStack_48 = (undefined1  [8])&local_68;
    values[0] = '\x02';
    values[1] = '\0';
    values[2] = '\0';
    values[3] = '\0';
    values[4] = '\0';
    values[5] = '\0';
    values[6] = '\0';
    values[7] = '\0';
    type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._8_8_ = 0;
    type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._M_payload =
         (_Storage<wasm::Type,_true>)extraout_RDX_00;
    pPVar7 = (PassRunner *)
             Builder::makeBlock<std::initializer_list<wasm::Expression_*>,_true>
                       ((Builder *)(values + 8),(initializer_list<wasm::Expression_*> *)auStack_48,
                        type_00);
    goto LAB_009e368e;
  }
  memory.super_IString.str._M_str = pcVar12;
  memory.super_IString.str._M_len = sVar11;
  pPVar7 = (PassRunner *)
           Builder::makeStore((Builder *)(values + 8),bytes,(Address)0x0,1,pEVar6,
                              (Expression *)pCVar5,TVar10,memory);
LAB_009e368e:
  bVar2 = false;
LAB_009e3693:
  if (!bVar2) {
    return (Expression *)pPVar7;
  }
  if (iVar3 != 1) {
    return (Expression *)0x0;
  }
  auStack_48 = (undefined1  [8])(memFill->memory).super_IString.str._M_len;
  values._0_8_ = (memFill->memory).super_IString.str._M_str;
  local_58 = memFill->dest;
  pEStack_50 = memFill->value;
  pSVar8 = (Store *)MixedArena::allocSpace((MixedArena *)(values._8_8_ + 0x200),0x58,8);
  *(undefined8 *)&(pSVar8->super_SpecificExpression<(wasm::Expression::Id)13>).super_Expression = 0;
  ((Type *)((long)&pSVar8->super_SpecificExpression<(wasm::Expression::Id)13> + 8))->id = 0;
  (pSVar8->align).addr = 0;
  ((Address *)&pSVar8->isAtomic)->addr = 0;
  *(undefined8 *)&pSVar8->bytes = 0;
  (pSVar8->offset).addr = 0;
  pSVar8->valueType = 0;
  *(size_t *)&pSVar8->memory = 0;
  *(char **)((long)&pSVar8->memory + 8) = (char *)0x0;
  (pSVar8->super_SpecificExpression<(wasm::Expression::Id)13>).super_Expression._id = StoreId;
  ((Type *)((long)&pSVar8->super_SpecificExpression<(wasm::Expression::Id)13> + 8))->id = 0;
  (pSVar8->offset).addr = 0;
  (pSVar8->align).addr = 0;
  *(undefined1 *)&((Address *)&pSVar8->isAtomic)->addr = 0;
  pSVar8->bytes = '\x01';
  (pSVar8->offset).addr = 0;
  (pSVar8->align).addr = 1;
  pSVar8->ptr = local_58;
  pSVar8->value = pEStack_50;
  pSVar8->valueType = 2;
  *(undefined1 (*) [8])&pSVar8->memory = auStack_48;
  *(undefined8 *)((long)&pSVar8->memory + 8) = values._0_8_;
  Store::finalize(pSVar8);
  return (Expression *)pSVar8;
}

Assistant:

Expression* optimizeMemoryFill(MemoryFill* memFill) {
    if (memFill->type == Type::unreachable) {
      return nullptr;
    }

    if (!memFill->size->is<Const>()) {
      return nullptr;
    }

    auto& options = getPassOptions();
    Builder builder(*getModule());

    auto* csize = memFill->size->cast<Const>();
    auto bytes = csize->value.getInteger();

    if (bytes == 0LL &&
        (options.ignoreImplicitTraps || options.trapsNeverHappen)) {
      // memory.fill(d, v, 0)  ==>  { drop(d), drop(v) }
      return builder.makeBlock(
        {builder.makeDrop(memFill->dest), builder.makeDrop(memFill->value)});
    }

    const uint32_t offset = 0, align = 1;

    if (auto* cvalue = memFill->value->dynCast<Const>()) {
      uint32_t value = cvalue->value.geti32() & 0xFF;
      // memory.fill(d, C1, C2)  ==>
      //   store(d, (C1 & 0xFF) * (-1U / max(bytes)))
      switch (bytes) {
        case 1: {
          return builder.makeStore(1, // bytes
                                   offset,
                                   align,
                                   memFill->dest,
                                   builder.makeConst<uint32_t>(value),
                                   Type::i32,
                                   memFill->memory);
        }
        case 2: {
          return builder.makeStore(2,
                                   offset,
                                   align,
                                   memFill->dest,
                                   builder.makeConst<uint32_t>(value * 0x0101U),
                                   Type::i32,
                                   memFill->memory);
        }
        case 4: {
          // transform only when "value" or shrinkLevel equal to zero due to
          // it could increase size by several bytes
          if (value == 0 || options.shrinkLevel == 0) {
            return builder.makeStore(
              4,
              offset,
              align,
              memFill->dest,
              builder.makeConst<uint32_t>(value * 0x01010101U),
              Type::i32,
              memFill->memory);
          }
          break;
        }
        case 8: {
          // transform only when "value" or shrinkLevel equal to zero due to
          // it could increase size by several bytes
          if (value == 0 || options.shrinkLevel == 0) {
            return builder.makeStore(
              8,
              offset,
              align,
              memFill->dest,
              builder.makeConst<uint64_t>(value * 0x0101010101010101ULL),
              Type::i64,
              memFill->memory);
          }
          break;
        }
        case 16: {
          if (options.shrinkLevel == 0) {
            if (getModule()->features.hasSIMD()) {
              uint8_t values[16];
              std::fill_n(values, 16, (uint8_t)value);
              return builder.makeStore(16,
                                       offset,
                                       align,
                                       memFill->dest,
                                       builder.makeConst<uint8_t[16]>(values),
                                       Type::v128,
                                       memFill->memory);
            } else {
              // { i64.store(d, C', 0), i64.store(d, C', 8) }
              auto destType = memFill->dest->type;
              Index tempLocal = builder.addVar(getFunction(), destType);
              return builder.makeBlock({
                builder.makeStore(
                  8,
                  offset,
                  align,
                  builder.makeLocalTee(tempLocal, memFill->dest, destType),
                  builder.makeConst<uint64_t>(value * 0x0101010101010101ULL),
                  Type::i64,
                  memFill->memory),
                builder.makeStore(
                  8,
                  offset + 8,
                  align,
                  builder.makeLocalGet(tempLocal, destType),
                  builder.makeConst<uint64_t>(value * 0x0101010101010101ULL),
                  Type::i64,
                  memFill->memory),
              });
            }
          }
          break;
        }
        default: {
        }
      }
    }
    // memory.fill(d, v, 1)  ==>  store8(d, v)
    if (bytes == 1LL) {
      return builder.makeStore(1,
                               offset,
                               align,
                               memFill->dest,
                               memFill->value,
                               Type::i32,
                               memFill->memory);
    }

    return nullptr;
  }